

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_expr2(JSParseState *s,int parse_flags)

{
  int iVar1;
  int iVar2;
  
  iVar1 = js_parse_assign_expr2(s,parse_flags);
  iVar2 = -1;
  if (iVar1 == 0) {
    while ((s->token).val == 0x2c) {
      iVar1 = next_token(s);
      if (iVar1 != 0) {
        return -1;
      }
      emit_op(s,'\x0e');
      iVar1 = js_parse_assign_expr2(s,parse_flags);
      if (iVar1 != 0) {
        return -1;
      }
      s->cur_func->last_opcode_pos = -1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static __exception int js_parse_expr2(JSParseState *s, int parse_flags)
{
    BOOL comma = FALSE;
    for(;;) {
        if (js_parse_assign_expr2(s, parse_flags))
            return -1;
        if (comma) {
            /* prevent get_lvalue from using the last expression
               as an lvalue. This also prevents the conversion of
               of get_var to get_ref for method lookup in function
               call inside `with` statement.
             */
            s->cur_func->last_opcode_pos = -1;
        }
        if (s->token.val != ',')
            break;
        comma = TRUE;
        if (next_token(s))
            return -1;
        emit_op(s, OP_drop);
    }
    return 0;
}